

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O2

void __thiscall QPostEventList::addEvent(QPostEventList *this,QPostEvent *ev)

{
  long lVar1;
  iterator iVar2;
  iterator iVar3;
  
  lVar1 = (this->super_QList<QPostEvent>).d.size;
  if (((lVar1 != 0) && ((this->super_QList<QPostEvent>).d.ptr[lVar1 + -1].priority < ev->priority))
     && (this->insertionOffset < lVar1)) {
    iVar2 = QList<QPostEvent>::begin(&this->super_QList<QPostEvent>);
    lVar1 = this->insertionOffset;
    iVar3 = QList<QPostEvent>::end(&this->super_QList<QPostEvent>);
    iVar2 = std::
            __upper_bound<QList<QPostEvent>::iterator,QPostEvent,__gnu_cxx::__ops::_Val_less_iter>
                      (iVar2.i + lVar1,iVar3.i,ev);
    QList<QPostEvent>::insert(&this->super_QList<QPostEvent>,(const_iterator)iVar2.i,ev);
    return;
  }
  QList<QPostEvent>::emplaceBack<QPostEvent_const&>(&this->super_QList<QPostEvent>,ev);
  return;
}

Assistant:

void QPostEventList::addEvent(const QPostEvent &ev)
{
    int priority = ev.priority;
    if (isEmpty() ||
            constLast().priority >= priority ||
            insertionOffset >= size()) {
        // optimization: we can simply append if the last event in
        // the queue has higher or equal priority
        append(ev);
    } else {
        // insert event in descending priority order, using upper
        // bound for a given priority (to ensure proper ordering
        // of events with the same priority)
        QPostEventList::iterator at = std::upper_bound(begin() + insertionOffset, end(), ev);
        insert(at, ev);
    }
}